

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

void __thiscall kj::_::Debug::Fault::fatal(Fault *this)

{
  Exception *pEVar1;
  Exception copy;
  Exception local_1b0;
  
  pEVar1 = this->exception;
  local_1b0.ownFile.content.ptr = (pEVar1->ownFile).content.ptr;
  local_1b0.ownFile.content.size_ = (pEVar1->ownFile).content.size_;
  local_1b0.ownFile.content.disposer = (pEVar1->ownFile).content.disposer;
  (pEVar1->ownFile).content.ptr = (char *)0x0;
  (pEVar1->ownFile).content.size_ = 0;
  local_1b0.file = pEVar1->file;
  local_1b0.line = pEVar1->line;
  local_1b0.type = pEVar1->type;
  local_1b0.description.content.ptr = (pEVar1->description).content.ptr;
  local_1b0.description.content.size_ = (pEVar1->description).content.size_;
  local_1b0.description.content.disposer = (pEVar1->description).content.disposer;
  (pEVar1->description).content.ptr = (char *)0x0;
  (pEVar1->description).content.size_ = 0;
  local_1b0.context.ptr.disposer = (pEVar1->context).ptr.disposer;
  local_1b0.context.ptr.ptr = (pEVar1->context).ptr.ptr;
  (pEVar1->context).ptr.ptr = (Context *)0x0;
  local_1b0.remoteTrace.content.ptr = (pEVar1->remoteTrace).content.ptr;
  local_1b0.remoteTrace.content.size_ = (pEVar1->remoteTrace).content.size_;
  local_1b0.remoteTrace.content.disposer = (pEVar1->remoteTrace).content.disposer;
  (pEVar1->remoteTrace).content.ptr = (char *)0x0;
  (pEVar1->remoteTrace).content.size_ = 0;
  memcpy(local_1b0.trace,pEVar1->trace,0x105);
  local_1b0.details.builder.ptr = (pEVar1->details).builder.ptr;
  local_1b0.details.builder.pos = (pEVar1->details).builder.pos;
  local_1b0.details.builder.endPtr = (pEVar1->details).builder.endPtr;
  local_1b0.details.builder.disposer = (pEVar1->details).builder.disposer;
  (pEVar1->details).builder.endPtr = (Detail *)0x0;
  (pEVar1->details).builder.ptr = (Detail *)0x0;
  (pEVar1->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  pEVar1 = this->exception;
  if (pEVar1 != (Exception *)0x0) {
    Exception::~Exception(pEVar1);
    operator_delete(pEVar1,400);
  }
  this->exception = (Exception *)0x0;
  throwFatalException(&local_1b0,1);
}

Assistant:

void Debug::Fault::fatal() {
  Exception copy = mv(*exception);
  delete exception;
  exception = nullptr;
  throwFatalException(mv(copy), 1);
  KJ_KNOWN_UNREACHABLE(abort());
}